

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res0.c
# Opt level: O0

int res0_inverse(vorbis_block *vb,vorbis_look_residue *vl,float **in,int *nonzero,int ch)

{
  int local_3c;
  int local_38;
  int used;
  int i;
  int ch_local;
  int *nonzero_local;
  float **in_local;
  vorbis_look_residue *vl_local;
  vorbis_block *vb_local;
  
  local_3c = 0;
  for (local_38 = 0; local_38 < ch; local_38 = local_38 + 1) {
    if (nonzero[local_38] != 0) {
      in[local_3c] = in[local_38];
      local_3c = local_3c + 1;
    }
  }
  if (local_3c == 0) {
    vb_local._4_4_ = 0;
  }
  else {
    vb_local._4_4_ = _01inverse(vb,vl,in,local_3c,vorbis_book_decodevs_add);
  }
  return vb_local._4_4_;
}

Assistant:

int res0_inverse(vorbis_block *vb,vorbis_look_residue *vl,
                 float **in,int *nonzero,int ch){
  int i,used=0;
  for(i=0;i<ch;i++)
    if(nonzero[i])
      in[used++]=in[i];
  if(used)
    return(_01inverse(vb,vl,in,used,vorbis_book_decodevs_add));
  else
    return(0);
}